

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86::forward
          (Convolution1D_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  pointer pMVar3;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  Layer *pLVar6;
  long lVar7;
  int iVar8;
  ParamDict pd;
  ParamDict local_190;
  int local_17c;
  Mat local_178;
  Mat local_128;
  undefined1 local_e0 [8];
  ModelBinFromMatArray local_d8;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  int iStack_68;
  Allocator *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  size_t local_40;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_e0 = (undefined1  [8])
             (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar1 = pMVar3[1].elempack;
  iVar2 = pMVar3[1].c;
  local_17c = pMVar3[1].w;
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  flatten(pMVar3 + 1,&local_178,opt);
  iVar8 = -100;
  local_178.elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
  uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
  if ((local_178.data == (void *)0x0) ||
     (local_178.elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize),
     uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
     (long)local_178.c * local_178.cstep == 0)) goto LAB_00572971;
  local_178.w = local_178.w * local_178.elempack;
  local_178.elemsize =
       CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) /
       (ulong)(long)local_178.elempack;
  local_178.elempack = 1;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elemsize = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  if ((this->super_Convolution1D).bias_term == 0) {
LAB_00572569:
    pLVar6 = create_layer_cpu(0x51);
    ParamDict::ParamDict(&local_190);
    ParamDict::set(&local_190,0,iVar1 * iVar2);
    ParamDict::set(&local_190,1,local_17c);
    ParamDict::set(&local_190,2,(this->super_Convolution1D).dilation_w);
    ParamDict::set(&local_190,3,(this->super_Convolution1D).stride_w);
    ParamDict::set(&local_190,4,(this->super_Convolution1D).pad_left);
    ParamDict::set(&local_190,0xf,(this->super_Convolution1D).pad_right);
    ParamDict::set(&local_190,0x12,(this->super_Convolution1D).pad_value);
    ParamDict::set(&local_190,5,(this->super_Convolution1D).bias_term);
    ParamDict::set(&local_190,6,local_178.w);
    ParamDict::set(&local_190,9,(this->super_Convolution1D).activation_type);
    ParamDict::set(&local_190,10,&(this->super_Convolution1D).activation_params);
    (*pLVar6->_vptr_Layer[2])(pLVar6,&local_190);
    lVar7 = 0x40;
    do {
      *(undefined8 *)((long)&local_c8.data + lVar7) = 0;
      *(undefined8 *)(local_e0 + lVar7 + -0x28) = 0;
      *(undefined8 *)(local_e0 + lVar7 + -0x20) = 0;
      *(undefined8 *)(local_e0 + lVar7 + -0x1c) = 0;
      *(undefined8 *)(local_e0 + lVar7 + -0x14) = 0;
      *(undefined8 *)(local_e0 + lVar7 + -8) = 0;
      *(undefined8 *)(local_e0 + lVar7) = 0;
      *(undefined8 *)(local_e0 + lVar7 + 4) = 0;
      *(undefined8 *)((long)&local_d8.super_ModelBin._vptr_ModelBin + lVar7 + 4) = 0;
      lVar7 = lVar7 + 0x48;
    } while (lVar7 != 0xd0);
    piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_c8.data = local_178.data;
    local_c8.refcount._0_4_ = local_178.refcount._0_4_;
    local_c8.refcount._4_4_ = local_178.refcount._4_4_;
    local_c8.elempack = local_178.elempack;
    local_c8.allocator = local_178.allocator;
    local_c8.dims = local_178.dims;
    local_c8.w = local_178.w;
    local_c8.h = local_178.h;
    local_c8.d = local_178.d;
    local_c8.c = local_178.c;
    local_c8.cstep = local_178.cstep;
    piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(uStack_74,uStack_78);
    local_c8.elemsize = local_178.elemsize;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_60 == (Allocator *)0x0) {
          if (local_80 != (void *)0x0) {
            free(local_80);
          }
        }
        else {
          (*local_60->_vptr_Allocator[3])();
          local_c8.elemsize = local_c8.elemsize;
        }
      }
    }
    local_80 = local_128.data;
    uStack_78 = local_128.refcount._0_4_;
    uStack_74 = local_128.refcount._4_4_;
    iStack_68 = local_128.elempack;
    local_60 = local_128.allocator;
    local_58 = CONCAT44(local_128.w,local_128.dims);
    uStack_50 = CONCAT44(local_128.d,local_128.h);
    local_48 = local_128.c;
    local_40 = local_128.cstep;
    uStack_70 = local_128.elemsize;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_d8,&local_c8);
    (*pLVar6->_vptr_Layer[3])(pLVar6,&local_d8);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_d8);
    (*pLVar6->_vptr_Layer[4])(pLVar6,opt);
    (*pLVar6->_vptr_Layer[7])(pLVar6,pMVar3,local_e0,opt);
    (*pLVar6->_vptr_Layer[5])(pLVar6,opt);
    (*pLVar6->_vptr_Layer[1])(pLVar6);
    lVar7 = 0x48;
    do {
      piVar4 = *(int **)((long)&local_c8.refcount + lVar7);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          __ptr = *(void **)((long)&local_c8.data + lVar7);
          plVar5 = *(long **)((long)&local_c8.allocator + lVar7);
          if (plVar5 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_c8.cstep + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.refcount + lVar7 + 4) = 0;
      *(undefined8 *)((long)&local_c8.elemsize + lVar7 + 4) = 0;
      *(undefined8 *)((long)&local_c8.data + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.refcount + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.dims + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.h + lVar7) = 0;
      *(undefined4 *)((long)&local_c8.c + lVar7) = 0;
      lVar7 = lVar7 + -0x48;
    } while (lVar7 != -0x48);
    ParamDict::~ParamDict(&local_190);
    iVar8 = 0;
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&local_128,opt);
    iVar8 = -100;
    local_128.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
    uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
    if ((local_128.data != (void *)0x0) &&
       (local_128.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize),
       uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
       (long)local_128.c * local_128.cstep != 0)) {
      local_128.w = local_128.w * local_128.elempack;
      local_128.elemsize =
           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) /
           (ulong)(long)local_128.elempack;
      local_128.elempack = 1;
      goto LAB_00572569;
    }
  }
  piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
LAB_00572971:
  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Convolution1D_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution1D);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(2, dilation_w);
    pd.set(3, stride_w);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}